

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygrep.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *key_00;
  int iVar1;
  FILE *__stream;
  FILE *input;
  char *key;
  int i;
  int opt;
  Settings set;
  char **argv_local;
  int argc_local;
  
  name = *argv;
  i._0_1_ = (byte)i & 0xfe;
  set._0_8_ = _stdout;
  set.output = (FILE *)argv;
  while (iVar1 = __posix_getopt(argc,set.output,"io:"), iVar1 != -1) {
    if (iVar1 == 0x69) {
      i._0_1_ = (byte)i & 0xfe | 1;
    }
    else {
      if (iVar1 != 0x6f) {
        fprintf(_stdout,"USAGE: %s [-i] [-o outfile] keyword [file...]\n",name);
        exit(1);
      }
      if ((FILE *)set._0_8_ != _stdout) {
        fclose((FILE *)set._0_8_);
      }
      set._0_8_ = fopen(_optarg,"w");
    }
  }
  if (set._0_8_ == 0) {
    fprintf(_stderr,"%s ERROR:\t",name);
    fprintf(_stderr,"couldn\'t open output file");
    fprintf(_stderr,"\n");
    exit(1);
  }
  if (_optind < argc) {
    key_00 = *(char **)(&(set.output)->_flags + (long)_optind * 2);
    key._0_4_ = _optind + 1;
    if ((int)key < argc) {
      for (; (int)key < argc; key._0_4_ = (int)key + 1) {
        __stream = fopen(*(char **)(&(set.output)->_flags + (long)(int)key * 2),"r");
        handle_file((FILE *)__stream,(Settings *)&i,key_00);
        fclose(__stream);
      }
    }
    else {
      handle_file(_stdin,(Settings *)&i,key_00);
    }
    exit(0);
  }
  fprintf(_stdout,"USAGE: %s [-i] [-o outfile] keyword [file...]\n",name);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	name = argv[0];

	Settings set = {0, stdout};
	int opt;

	while ((opt = getopt(argc, argv, "io:")) != -1)
	{
		switch (opt)
		{
		case 'i':
			set.i = 1;
			break;
		case 'o':
			if (set.output != stdout)
				fclose(set.output);
			set.output = fopen(optarg, "w");
			break;
		default:
			USAGE();
		}
	}

	if (set.output == NULL)
	{
		ERROR_EXIT("couldn't open output file");
	}

	if (optind >= argc)
	{
		USAGE();
	}
	int i = optind;

	char *key = argv[i];

	i++;

	if (i >= argc)
	{
		handle_file(stdin, &set, key);
	}
	else
	{
		for (; i < argc; i++)
		{

			FILE *input = fopen(argv[i], "r");

			handle_file(input, &set, key);
			fclose(input);
		}
	}
	exit(EXIT_SUCCESS);
}